

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int graphicMode(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  if (tinyfd_forceConsole != 0) {
    iVar1 = isTerminalRunning();
    if (iVar1 != 0) {
      return 0;
    }
    pcVar2 = terminalName();
    if (pcVar2 != (char *)0x0) {
      return 0;
    }
  }
  pcVar2 = getenv("DISPLAY");
  uVar3 = 1;
  if (pcVar2 == (char *)0x0) {
    iVar1 = isDarwin();
    if (iVar1 == 0) {
      uVar3 = 0;
    }
    else {
      pcVar2 = getenv("SSH_TTY");
      if (pcVar2 != (char *)0x0) {
        pcVar2 = getenv("DISPLAY");
        uVar3 = (uint)(pcVar2 != (char *)0x0);
      }
    }
  }
  return uVar3;
}

Assistant:

static int graphicMode( )
{
        return !( tinyfd_forceConsole && (isTerminalRunning() || terminalName()) )
          && ( getenv("DISPLAY")
            || (isDarwin() && (!getenv("SSH_TTY") || getenv("DISPLAY") ) ) ) ;
}